

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  TValue *pTVar1;
  char *name;
  char *local_18;
  
  local_18 = (char *)0x0;
  pTVar1 = debug_localname(L,ar,&local_18,n);
  if (local_18 != (char *)0x0) {
    *pTVar1 = L->top[-1];
  }
  L->top = L->top + -1;
  return local_18;
}

Assistant:

LUA_API const char *lua_setlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  TValue *o = debug_localname(L, ar, &name, (BCReg)n);
  if (name)
    copyTV(L, o, L->top-1);
  L->top--;
  return name;
}